

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readInputImage.cpp
# Opt level: O0

void readInputImage(char *inFileName,float padTop,float padBottom,Envmap overrideType,bool verbose,
                   EnvmapImage *image,Header *header,RgbaChannels *channels)

{
  char *pcVar1;
  char *in_RDI;
  RgbaChannels *in_stack_00000298;
  Header *in_stack_000002a0;
  EnvmapImage *in_stack_000002a8;
  undefined1 in_stack_000002b3;
  Envmap in_stack_000002b4;
  float in_stack_000002b8;
  float in_stack_000002bc;
  char *in_stack_000002c0;
  RgbaChannels *in_stack_00000540;
  Header *in_stack_00000548;
  EnvmapImage *in_stack_00000550;
  undefined1 in_stack_0000055f;
  char *in_stack_00000560;
  
  pcVar1 = strchr(in_RDI,0x25);
  if (pcVar1 == (char *)0x0) {
    anon_unknown.dwarf_19c7a::readSingleImage
              (in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,in_stack_000002b4,
               (bool)in_stack_000002b3,in_stack_000002a8,in_stack_000002a0,in_stack_00000298);
  }
  else {
    anon_unknown.dwarf_19c7a::readSixImages
              (in_stack_00000560,(bool)in_stack_0000055f,in_stack_00000550,in_stack_00000548,
               in_stack_00000540);
  }
  return;
}

Assistant:

void
readInputImage (
    const char    inFileName[],
    float         padTop,
    float         padBottom,
    Envmap        overrideType,
    bool          verbose,
    EnvmapImage&  image,
    Header&       header,
    RgbaChannels& channels)
{
    if (strchr (inFileName, '%'))
    {
        readSixImages (inFileName, verbose, image, header, channels);
    }
    else
    {
        readSingleImage (
            inFileName,
            padTop,
            padBottom,
            overrideType,
            verbose,
            image,
            header,
            channels);
    }
}